

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O2

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *q)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  secp256k1_fe *psVar13;
  uint64_t *puVar14;
  secp256k1_fe *psVar15;
  bool bVar16;
  byte bVar17;
  uint negative;
  secp256k1_ge t;
  secp256k1_fe local_be8;
  secp256k1_scalar v2;
  secp256k1_scalar v1;
  secp256k1_fe global_z;
  secp256k1_scalar s;
  secp256k1_ge pre_a_lam [16];
  secp256k1_ge pre_a [16];
  
  bVar17 = 0;
  if (a->infinity == 0) {
    secp256k1_scalar_add(&s,q,&secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s,&s);
    secp256k1_scalar_split_lambda(&v1,&v2,&s);
    secp256k1_scalar_add(&v1,&v1,&secp256k1_ecmult_const::S_OFFSET);
    secp256k1_scalar_add(&v2,&v2,&secp256k1_ecmult_const::S_OFFSET);
    r->infinity = a->infinity;
    (r->x).n[4] = (a->x).n[4];
    uVar1 = (a->x).n[0];
    uVar2 = (a->x).n[1];
    uVar3 = (a->x).n[3];
    (r->x).n[2] = (a->x).n[2];
    (r->x).n[3] = uVar3;
    (r->x).n[0] = uVar1;
    (r->x).n[1] = uVar2;
    uVar1 = (a->y).n[1];
    uVar2 = (a->y).n[2];
    uVar3 = (a->y).n[3];
    (r->y).n[0] = (a->y).n[0];
    (r->y).n[1] = uVar1;
    (r->y).n[2] = uVar2;
    (r->y).n[3] = uVar3;
    (r->y).n[4] = (a->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    secp256k1_ecmult_odd_multiples_table(0x10,pre_a,&pre_a_lam[0].x,&global_z,r);
    secp256k1_ge_table_set_globalz(0x10,pre_a,&pre_a_lam[0].x);
    for (lVar11 = 0; lVar11 != 0x580; lVar11 = lVar11 + 0x58) {
      psVar13 = (secp256k1_fe *)((long)pre_a_lam[0].x.n + lVar11);
      puVar14 = (uint64_t *)((long)pre_a[0].x.n + lVar11);
      psVar15 = psVar13;
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        psVar15->n[0] = *puVar14;
        puVar14 = puVar14 + (ulong)bVar17 * -2 + 1;
        psVar15 = (secp256k1_fe *)((long)psVar15 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      secp256k1_fe_impl_mul(psVar13,psVar13,&secp256k1_const_beta);
    }
    psVar15 = &t.y;
    for (iVar7 = 0x19; -1 < iVar7; iVar7 = iVar7 + -1) {
      uVar4 = secp256k1_scalar_get_bits_var(&v1,iVar7 * 5,5);
      uVar5 = secp256k1_scalar_get_bits_var(&v2,iVar7 * 5,5);
      uVar6 = uVar4 >> 4 ^ 1;
      t.x.n[4] = pre_a[0].x.n[4];
      t.x.n[2] = pre_a[0].x.n[2];
      t.x.n[3] = pre_a[0].x.n[3];
      t.x.n[0] = pre_a[0].x.n[0];
      t.x.n[1] = pre_a[0].x.n[1];
      t.y.n[0] = pre_a[0].y.n[0];
      t.y.n[1] = pre_a[0].y.n[1];
      t.y.n[4] = pre_a[0].y.n[4];
      t.y.n[2] = pre_a[0].y.n[2];
      t.y.n[3] = pre_a[0].y.n[3];
      psVar13 = &pre_a[1].y;
      for (uVar12 = 1; uVar12 != 0x10; uVar12 = uVar12 + 1) {
        uVar9 = (uint)(((-uVar6 ^ uVar4) & 0xf) == uVar12);
        secp256k1_fe_impl_cmov(&t.x,(secp256k1_fe *)(psVar13 + -1),uVar9);
        secp256k1_fe_impl_cmov(psVar15,psVar13,uVar9);
        psVar13 = (secp256k1_fe *)((long)(psVar13 + 2) + 8);
      }
      t.infinity = 0;
      local_be8.n[0] = 0x3ffffbfffff0bc - t.y.n[0];
      local_be8.n[1] = 0x3ffffffffffffc - t.y.n[1];
      local_be8.n[2] = 0x3ffffffffffffc - t.y.n[2];
      local_be8.n[3] = 0x3ffffffffffffc - t.y.n[3];
      local_be8.n[4] = 0x3fffffffffffc - t.y.n[4];
      secp256k1_fe_impl_cmov(psVar15,&local_be8,uVar6);
      if (iVar7 == 0x19) {
        r->infinity = t.infinity;
        (r->x).n[4] = t.x.n[4];
        (r->x).n[2] = t.x.n[2];
        (r->x).n[3] = t.x.n[3];
        (r->x).n[0] = t.x.n[0];
        (r->x).n[1] = t.x.n[1];
        (r->y).n[0] = t.y.n[0];
        (r->y).n[1] = t.y.n[1];
        (r->y).n[2] = t.y.n[2];
        (r->y).n[3] = t.y.n[3];
        (r->y).n[4] = t.y.n[4];
        (r->z).n[0] = 1;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
      }
      else {
        iVar10 = 5;
        while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
          secp256k1_gej_double(r,r);
        }
        secp256k1_gej_add_ge(r,r,&t);
      }
      uVar6 = uVar5 >> 4 ^ 1;
      t.x.n[4] = pre_a_lam[0].x.n[4];
      t.x.n[2] = pre_a_lam[0].x.n[2];
      t.x.n[3] = pre_a_lam[0].x.n[3];
      t.x.n[0] = pre_a_lam[0].x.n[0];
      t.x.n[1] = pre_a_lam[0].x.n[1];
      t.y.n[0] = pre_a_lam[0].y.n[0];
      t.y.n[1] = pre_a_lam[0].y.n[1];
      t.y.n[4] = pre_a_lam[0].y.n[4];
      t.y.n[2] = pre_a_lam[0].y.n[2];
      t.y.n[3] = pre_a_lam[0].y.n[3];
      psVar13 = &pre_a_lam[1].y;
      for (uVar12 = 1; uVar12 != 0x10; uVar12 = uVar12 + 1) {
        uVar9 = (uint)(((-uVar6 ^ uVar5) & 0xf) == uVar12);
        secp256k1_fe_impl_cmov(&t.x,(secp256k1_fe *)(psVar13 + -1),uVar9);
        secp256k1_fe_impl_cmov(psVar15,psVar13,uVar9);
        psVar13 = (secp256k1_fe *)((long)(psVar13 + 2) + 8);
      }
      t.infinity = 0;
      local_be8.n[0] = 0x3ffffbfffff0bc - t.y.n[0];
      local_be8.n[1] = 0x3ffffffffffffc - t.y.n[1];
      local_be8.n[2] = 0x3ffffffffffffc - t.y.n[2];
      local_be8.n[3] = 0x3ffffffffffffc - t.y.n[3];
      local_be8.n[4] = 0x3fffffffffffc - t.y.n[4];
      secp256k1_fe_impl_cmov(psVar15,&local_be8,uVar6);
      secp256k1_gej_add_ge(r,r,&t);
    }
    secp256k1_fe_impl_mul(&r->z,&r->z,&global_z);
  }
  else {
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
    (r->z).n[0] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *q) {
    /* The approach below combines the signed-digit logic from Mike Hamburg's
     * "Fast and compact elliptic-curve cryptography" (https://eprint.iacr.org/2012/309)
     * Section 3.3, with the GLV endomorphism.
     *
     * The idea there is to interpret the bits of a scalar as signs (1 = +, 0 = -), and compute a
     * point multiplication in that fashion. Let v be an n-bit non-negative integer (0 <= v < 2^n),
     * and v[i] its i'th bit (so v = sum(v[i] * 2^i, i=0..n-1)). Then define:
     *
     *   C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *
     * Then it holds that C_l(v, A) = sum((2*v[i] - 1) * 2^i*A, i=0..l-1)
     *                              = (2*sum(v[i] * 2^i, i=0..l-1) + 1 - 2^l) * A
     *                              = (2*v + 1 - 2^l) * A
     *
     * Thus, one can compute q*A as C_256((q + 2^256 - 1) / 2, A). This is the basis for the
     * paper's signed-digit multi-comb algorithm for multiplication using a precomputed table.
     *
     * It is appealing to try to combine this with the GLV optimization: the idea that a scalar
     * s can be written as s1 + lambda*s2, where lambda is a curve-specific constant such that
     * lambda*A is easy to compute, and where s1 and s2 are small. In particular we have the
     * secp256k1_scalar_split_lambda function which performs such a split with the resulting s1
     * and s2 in range (-2^128, 2^128) mod n. This does work, but is uninteresting:
     *
     *   To compute q*A:
     *   - Let s1, s2 = split_lambda(q)
     *   - Let R1 = C_256((s1 + 2^256 - 1) / 2, A)
     *   - Let R2 = C_256((s2 + 2^256 - 1) / 2, lambda*A)
     *   - Return R1 + R2
     *
     * The issue is that while s1 and s2 are small-range numbers, (s1 + 2^256 - 1) / 2 (mod n)
     * and (s2 + 2^256 - 1) / 2 (mod n) are not, undoing the benefit of the splitting.
     *
     * To make it work, we want to modify the input scalar q first, before splitting, and then only
     * add a 2^128 offset of the split results (so that they end up in the single 129-bit range
     * [0,2^129]). A slightly smaller offset would work due to the bounds on the split, but we pick
     * 2^128 for simplicity. Let s be the scalar fed to split_lambda, and f(q) the function to
     * compute it from q:
     *
     *   To compute q*A:
     *   - Compute s = f(q)
     *   - Let s1, s2 = split_lambda(s)
     *   - Let v1 = s1 + 2^128 (mod n)
     *   - Let v2 = s2 + 2^128 (mod n)
     *   - Let R1 = C_l(v1, A)
     *   - Let R2 = C_l(v2, lambda*A)
     *   - Return R1 + R2
     *
     * l will thus need to be at least 129, but we may overshoot by a few bits (see
     * further), so keep it as a variable.
     *
     * To solve for s, we reason:
     *     q*A  = R1 + R2
     * <=> q*A  = C_l(s1 + 2^128, A) + C_l(s2 + 2^128, lambda*A)
     * <=> q*A  = (2*(s1 + 2^128) + 1 - 2^l) * A + (2*(s2 + 2^128) + 1 - 2^l) * lambda*A
     * <=> q*A  = (2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda)) * A
     * <=> q    = 2*(s1 + s2*lambda) + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> q    = 2*s + (2^129 + 1 - 2^l) * (1 + lambda) (mod n)
     * <=> s    = (q + (2^l - 2^129 - 1) * (1 + lambda)) / 2 (mod n)
     * <=> f(q) = (q + K) / 2 (mod n)
     *            where K = (2^l - 2^129 - 1)*(1 + lambda) (mod n)
     *
     * We will process the computation of C_l(v1, A) and C_l(v2, lambda*A) in groups of
     * ECMULT_CONST_GROUP_SIZE, so we set l to the smallest multiple of ECMULT_CONST_GROUP_SIZE
     * that is not less than 129; this equals ECMULT_CONST_BITS.
     */

    /* The offset to add to s1 and s2 to make them non-negative. Equal to 2^128. */
    static const secp256k1_scalar S_OFFSET = SECP256K1_SCALAR_CONST(0, 0, 0, 1, 0, 0, 0, 0);
    secp256k1_scalar s, v1, v2;
    secp256k1_ge pre_a[ECMULT_CONST_TABLE_SIZE];
    secp256k1_ge pre_a_lam[ECMULT_CONST_TABLE_SIZE];
    secp256k1_fe global_z;
    int group, i;

    /* We're allowed to be non-constant time in the point, and the code below (in particular,
     * secp256k1_ecmult_const_odd_multiples_table_globalz) cannot deal with infinity in a
     * constant-time manner anyway. */
    if (secp256k1_ge_is_infinity(a)) {
        secp256k1_gej_set_infinity(r);
        return;
    }

    /* Compute v1 and v2. */
    secp256k1_scalar_add(&s, q, &secp256k1_ecmult_const_K);
    secp256k1_scalar_half(&s, &s);
    secp256k1_scalar_split_lambda(&v1, &v2, &s);
    secp256k1_scalar_add(&v1, &v1, &S_OFFSET);
    secp256k1_scalar_add(&v2, &v2, &S_OFFSET);

#ifdef VERIFY
    /* Verify that v1 and v2 are in range [0, 2^129-1]. */
    for (i = 129; i < 256; ++i) {
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v1, i, 1) == 0);
        VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&v2, i, 1) == 0);
    }
#endif

    /* Calculate odd multiples of A and A*lambda.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in global_z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_const_odd_multiples_table_globalz(pre_a, &global_z, r);
    for (i = 0; i < ECMULT_CONST_TABLE_SIZE; i++) {
        secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
    }

    /* Next, we compute r = C_l(v1, A) + C_l(v2, lambda*A).
     *
     * We proceed in groups of ECMULT_CONST_GROUP_SIZE bits, operating on that many bits
     * at a time, from high in v1, v2 to low. Call these bits1 (from v1) and bits2 (from v2).
     *
     * Now note that ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1) loads into t a point equal
     * to C_{ECMULT_CONST_GROUP_SIZE}(bits1, A), and analogously for pre_lam_a / bits2.
     * This means that all we need to do is add these looked up values together, multiplied
     * by 2^(ECMULT_GROUP_SIZE * group).
     */
    for (group = ECMULT_CONST_GROUPS - 1; group >= 0; --group) {
        /* Using the _var get_bits function is ok here, since it's only variable in offset and count, not in the scalar. */
        unsigned int bits1 = secp256k1_scalar_get_bits_var(&v1, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        unsigned int bits2 = secp256k1_scalar_get_bits_var(&v2, group * ECMULT_CONST_GROUP_SIZE, ECMULT_CONST_GROUP_SIZE);
        secp256k1_ge t;
        int j;

        ECMULT_CONST_TABLE_GET_GE(&t, pre_a, bits1);
        if (group == ECMULT_CONST_GROUPS - 1) {
            /* Directly set r in the first iteration. */
            secp256k1_gej_set_ge(r, &t);
        } else {
            /* Shift the result so far up. */
            for (j = 0; j < ECMULT_CONST_GROUP_SIZE; ++j) {
                secp256k1_gej_double(r, r);
            }
            secp256k1_gej_add_ge(r, r, &t);
        }
        ECMULT_CONST_TABLE_GET_GE(&t, pre_a_lam, bits2);
        secp256k1_gej_add_ge(r, r, &t);
    }

    /* Map the result back to the secp256k1 curve from the isomorphic curve. */
    secp256k1_fe_mul(&r->z, &r->z, &global_z);
}